

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

ScenarioUpperBound * __thiscall
despot::Chain::CreateScenarioUpperBound(Chain *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  ostream *poVar2;
  string *particle_bound_name_local;
  string *name_local;
  Chain *this_local;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_local = (Chain *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_local,&this->super_DSPOMDP);
  }
  else {
    bVar1 = std::operator==(name,"LOOKAHEAD");
    if (bVar1) {
      this_local = (Chain *)operator_new(8);
      OneStepLookaheadChainParticleUpperBound::OneStepLookaheadChainParticleUpperBound
                ((OneStepLookaheadChainParticleUpperBound *)this_local,&this->super_DSPOMDP);
    }
    else {
      bVar1 = std::operator==(name,"MDP");
      if (!bVar1) {
        bVar1 = std::operator==(name,"DEFAULT");
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported base upper bound: ");
          poVar2 = std::operator<<(poVar2,(string *)name);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
      }
      this_local = (Chain *)operator_new(8);
      ApproxMDPChainParticleUpperBound::ApproxMDPChainParticleUpperBound
                ((ApproxMDPChainParticleUpperBound *)this_local);
    }
  }
  return (ScenarioUpperBound *)this_local;
}

Assistant:

ScenarioUpperBound* Chain::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "LOOKAHEAD") {
		return new OneStepLookaheadChainParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new ApproxMDPChainParticleUpperBound();
	} else {
		cerr << "Unsupported base upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}